

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playera.cpp
# Opt level: O0

void __thiscall PlayerA::SetConfiguration(PlayerA *this,Config *config)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  UINT8 UVar4;
  undefined2 uVar5;
  UINT32 UVar6;
  undefined4 uVar7;
  double oldPbSpeed;
  Config *config_local;
  PlayerA *this_local;
  
  dVar2 = (this->_config).pbSpeed;
  bVar3 = config->ignoreVolGain;
  UVar4 = config->chnInvert;
  uVar5 = *(undefined2 *)&config->field_0x6;
  (this->_config).masterVol = config->masterVol;
  (this->_config).ignoreVolGain = bVar3;
  (this->_config).chnInvert = UVar4;
  *(undefined2 *)&(this->_config).field_0x6 = uVar5;
  UVar6 = config->fadeSmpls;
  (this->_config).loopCount = config->loopCount;
  (this->_config).fadeSmpls = UVar6;
  uVar7 = *(undefined4 *)&config->field_0x14;
  (this->_config).endSilenceSmpls = config->endSilenceSmpls;
  *(undefined4 *)&(this->_config).field_0x14 = uVar7;
  (this->_config).pbSpeed = config->pbSpeed;
  SetMasterVolume(this,(this->_config).masterVol);
  pdVar1 = &(this->_config).pbSpeed;
  if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
    SetPlaybackSpeed(this,(this->_config).pbSpeed);
  }
  return;
}

Assistant:

void PlayerA::SetConfiguration(const PlayerA::Config& config)
{
	double oldPbSpeed = _config.pbSpeed;
	
	_config = config;
	SetMasterVolume(_config.masterVol);
	if (oldPbSpeed != _config.pbSpeed)
		SetPlaybackSpeed(_config.pbSpeed);	// refresh in all players
	return;
}